

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  IConfig *pIVar4;
  TestCaseTracker *this_00;
  Counts *assertions_local;
  RunContext *this_local;
  
  sVar3 = Counts::total(assertions);
  if (sVar3 == 0) {
    pIVar4 = Ptr<const_Catch::IConfig>::operator->(&this->m_config);
    uVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if ((uVar2 & 1) != 0) {
      this_00 = Option<Catch::SectionTracking::TestCaseTracker>::operator->
                          (&this->m_testCaseTracker);
      bVar1 = SectionTracking::TestCaseTracker::currentSectionHasChildren(this_00);
      if (!bVar1) {
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
        assertions->failed = assertions->failed + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool testForMissingAssertions( Counts& assertions ) {
            if( assertions.total() != 0 ||
                    !m_config->warnAboutMissingAssertions() ||
                    m_testCaseTracker->currentSectionHasChildren() )
                return false;
            m_totals.assertions.failed++;
            assertions.failed++;
            return true;
        }